

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_pax_extension
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  wchar_t wVar1;
  long lVar2;
  int64_t iVar3;
  char *pcVar4;
  char *_p;
  wchar_t local_e4;
  wchar_t local_d4;
  wchar_t r;
  wchar_t err;
  archive_string attr_name;
  archive_string *pas;
  archive_string_conv *sconv;
  char *name_start;
  char *attr_start;
  char *p;
  archive_entry_header_ustar *header;
  ssize_t did_read;
  ssize_t to_read;
  size_t name_length;
  size_t value_length;
  size_t line_length;
  int64_t ext_padding;
  int64_t ext_size;
  size_t max_size_name;
  size_t max_parsed_line_length;
  int64_t ext_size_limit;
  size_t *unconsumed_local;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  max_parsed_line_length = 0x40000000;
  max_size_name = 99999999;
  ext_size = 0x200;
  attr_name.buffer_length = 0;
  local_d4 = L'\0';
  ext_size_limit = (int64_t)unconsumed;
  unconsumed_local = (size_t *)h;
  h_local = entry;
  entry_local = (archive_entry *)tar;
  tar_local = (tar *)a;
  ext_padding = tar_atol((char *)((long)h + 0x7c),0xc);
  if (ext_padding < 0x1000000000000000) {
    if (ext_padding < 0) {
      archive_set_error((archive *)tar_local,0x16,"pax extension header has invalid size: %lld",
                        ext_padding);
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      line_length = -ext_padding & 0x1ff;
      if (ext_padding < 0x40000001) {
        tar_flush_unconsumed((archive_read *)tar_local,(size_t *)ext_size_limit);
        _r = (char *)0x0;
        attr_name.s = (char *)0x0;
        attr_name.length = 0;
        while (0 < ext_padding) {
          did_read = 0x200;
          if (ext_padding < 0x200) {
            did_read = ext_padding;
          }
          pcVar4 = (char *)__archive_read_ahead
                                     ((archive_read *)tar_local,did_read,(ssize_t *)&header);
          if (pcVar4 == (char *)0x0) {
            archive_set_error((archive *)tar_local,0x16,
                              "Truncated tar archive detected while reading pax attribute name");
            return L'\xffffffe2';
          }
          if (ext_padding < (long)header) {
            header = (archive_entry_header_ustar *)ext_padding;
          }
          value_length = 0;
          attr_start = pcVar4;
          while( true ) {
            if (pcVar4 + (long)header <= attr_start) {
              archive_set_error((archive *)tar_local,-1,
                                "Ignoring malformed pax attributes: overlarge attribute size field")
              ;
              *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
              return L'\xffffffec';
            }
            if (*attr_start == ' ') break;
            if ((*attr_start < '0') || ('9' < *attr_start)) {
              archive_set_error((archive *)tar_local,-1,
                                "Ignoring malformed pax attributes: malformed attribute size field")
              ;
              *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
              return L'\xffffffec';
            }
            value_length = (long)(*attr_start + -0x30) + value_length * 10;
            if (99999999 < value_length) {
              archive_set_error((archive *)tar_local,-1,
                                "Ignoring malformed pax attribute: size > %lld",99999999);
              *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
              return L'\xffffffec';
            }
            attr_start = attr_start + 1;
          }
          _p = attr_start + 1;
          if (ext_padding < (long)value_length) {
            archive_set_error((archive *)tar_local,-1,
                              "Ignoring malformed pax attribute:  %lld > %lld",value_length,
                              ext_padding);
            *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
            return L'\xffffffec';
          }
          if (((pcVar4 + (long)header <= _p) || (pcVar4 + value_length <= _p)) ||
             (attr_start = _p, *_p == '=')) {
            archive_set_error((archive *)tar_local,-1,
                              "Ignoring malformed pax attributes: empty name found");
            *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
            return L'\xffffffec';
          }
          while( true ) {
            if ((pcVar4 + (long)header <= attr_start) || (pcVar4 + value_length <= attr_start)) {
              archive_set_error((archive *)tar_local,-1,
                                "Ignoring malformed pax attributes: overlarge attribute name");
              *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
              return L'\xffffffec';
            }
            if (*attr_start == '=') break;
            attr_start = attr_start + 1;
          }
          to_read = (long)attr_start - (long)_p;
          attr_name.s = (char *)0x0;
          archive_strncat((archive_string *)&r,_p,to_read);
          ext_padding = ext_padding - (long)(attr_start + (1 - (long)pcVar4));
          name_length = value_length - (long)(attr_start + (1 - (long)pcVar4));
          *(char **)ext_size_limit = attr_start + *(long *)ext_size_limit + (1 - (long)pcVar4);
          tar_flush_unconsumed((archive_read *)tar_local,(size_t *)ext_size_limit);
          local_e4 = pax_attribute((archive_read *)tar_local,(tar *)entry_local,
                                   (archive_entry *)h_local,_r,(size_t)attr_name.s,name_length - 1,
                                   (size_t *)ext_size_limit);
          ext_padding = ext_padding - (name_length - 1);
          archive_string_free((archive_string *)&r);
          if (local_e4 < L'\xffffffec') {
            *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
            return local_e4;
          }
          if (local_d4 < local_e4) {
            local_e4 = local_d4;
          }
          local_d4 = local_e4;
          tar_flush_unconsumed((archive_read *)tar_local,(size_t *)ext_size_limit);
          pcVar4 = (char *)__archive_read_ahead((archive_read *)tar_local,1,(ssize_t *)&header);
          if (pcVar4 == (char *)0x0) {
            archive_set_error((archive *)tar_local,0x16,
                              "Truncated tar archive detected while completing pax attribute");
            return L'\xffffffe2';
          }
          if (*pcVar4 != '\n') {
            archive_set_error((archive *)tar_local,0x16,"Malformed pax attributes");
            *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
            return L'\xffffffec';
          }
          ext_padding = ext_padding + -1;
          *(long *)ext_size_limit = *(long *)ext_size_limit + 1;
          tar_flush_unconsumed((archive_read *)tar_local,(size_t *)ext_size_limit);
        }
        *(size_t *)ext_size_limit = ext_padding + line_length + *(long *)ext_size_limit;
        if ((int)(entry_local->ae_stat).aest_devmajor == 0) {
          pas = *(archive_string **)&(entry_local->ae_fflags_text).aes_set;
        }
        else {
          pas = (archive_string *)
                archive_string_conversion_from_charset((archive *)tar_local,"UTF-8",L'\x01');
          if ((archive_string_conv *)pas == (archive_string_conv *)0x0) {
            return L'\xffffffe2';
          }
          if (*(int *)((long)&(entry_local->ae_gname).aes_mbs.length + 4) != 0) {
            archive_string_conversion_set_opt((archive_string_conv *)pas,L'\x01');
          }
        }
        attr_name.buffer_length = 0;
        if (*(long *)&(entry_local->ae_stat).aest_atime_nsec == 0) {
          if (entry_local->stat != (void *)0x0) {
            attr_name.buffer_length = (size_t)entry_local;
          }
        }
        else {
          attr_name.buffer_length = (size_t)&entry_local->ae_stat;
        }
        if ((attr_name.buffer_length != 0) &&
           (wVar1 = _archive_entry_copy_pathname_l
                              ((archive_entry *)h_local,*(char **)attr_name.buffer_length,
                               *(size_t *)(attr_name.buffer_length + 8),(archive_string_conv *)pas),
           wVar1 != L'\0')) {
          local_d4 = set_conversion_failed_error
                               ((archive_read *)tar_local,(archive_string_conv *)pas,"Pathname");
          if (local_d4 == L'\xffffffe2') {
            return L'\xffffffe2';
          }
          archive_entry_copy_pathname((archive_entry *)h_local,*(char **)attr_name.buffer_length);
        }
        if (((entry_local->ae_stat).aest_mtime != 0) &&
           (wVar1 = _archive_entry_copy_uname_l
                              ((archive_entry *)h_local,
                               *(char **)&(entry_local->ae_stat).aest_ctime_nsec,
                               (entry_local->ae_stat).aest_mtime,(archive_string_conv *)pas),
           wVar1 != L'\0')) {
          local_d4 = set_conversion_failed_error
                               ((archive_read *)tar_local,(archive_string_conv *)pas,"Uname");
          if (local_d4 == L'\xffffffe2') {
            return L'\xffffffe2';
          }
          archive_entry_copy_uname
                    ((archive_entry *)h_local,*(char **)&(entry_local->ae_stat).aest_ctime_nsec);
        }
        if ((*(long *)&(entry_local->ae_stat).aest_birthtime_nsec != 0) &&
           (wVar1 = _archive_entry_copy_gname_l
                              ((archive_entry *)h_local,
                               (char *)(entry_local->ae_stat).aest_birthtime,
                               *(size_t *)&(entry_local->ae_stat).aest_birthtime_nsec,
                               (archive_string_conv *)pas), wVar1 != L'\0')) {
          local_d4 = set_conversion_failed_error
                               ((archive_read *)tar_local,(archive_string_conv *)pas,"Gname");
          if (local_d4 == L'\xffffffe2') {
            return L'\xffffffe2';
          }
          archive_entry_copy_gname
                    ((archive_entry *)h_local,(char *)(entry_local->ae_stat).aest_birthtime);
        }
        if ((*(long *)&(entry_local->ae_stat).aest_nlink != 0) &&
           (wVar1 = _archive_entry_copy_link_l
                              ((archive_entry *)h_local,(char *)(entry_local->ae_stat).aest_ino,
                               *(size_t *)&(entry_local->ae_stat).aest_nlink,
                               (archive_string_conv *)pas), wVar1 != L'\0')) {
          local_d4 = set_conversion_failed_error
                               ((archive_read *)tar_local,(archive_string_conv *)pas,"Linkpath");
          if (local_d4 == L'\xffffffe2') {
            return L'\xffffffe2';
          }
          archive_entry_copy_link((archive_entry *)h_local,(char *)(entry_local->ae_stat).aest_ino);
        }
        (entry_local->ae_stat).aest_rdev = -(entry_local->ae_stat).aest_devminor & 0x1ff;
        a_local._4_4_ = local_d4;
      }
      else {
        lVar2 = ext_padding + line_length;
        iVar3 = __archive_read_consume((archive_read *)tar_local,ext_padding + line_length);
        if (lVar2 == iVar3) {
          archive_set_error((archive *)tar_local,0x16,"Ignoring oversized pax extensions: %d > %d",
                            ext_padding & 0xffffffff,0x40000000);
          a_local._4_4_ = L'\xffffffec';
        }
        else {
          a_local._4_4_ = L'\xffffffe2';
        }
      }
    }
  }
  else {
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
header_pax_extension(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	/* Sanity checks: The largest `x` body I've ever heard of was
	 * a little over 4MB.  So I doubt there has ever been a
	 * well-formed archive with an `x` body over 1GiB.  Similarly,
	 * it seems plausible that no single attribute has ever been
	 * larger than 100MB.  So if we see a larger value here, it's
	 * almost certainly a sign of a corrupted/malicious archive. */

	/* Maximum sane size for extension body: 1 GiB */
	/* This cannot be raised to larger than 8GiB without
	 * exceeding the maximum size for a standard ustar
	 * entry. */
	const int64_t ext_size_limit = 1024 * 1024 * (int64_t)1024;
	/* Maximum size for a single line/attr: 100 million characters */
	/* This cannot be raised to more than 2GiB without exceeding
	 * a `size_t` on 32-bit platforms. */
	const size_t max_parsed_line_length = 99999999ULL;
	/* Largest attribute prolog:  size + name. */
	const size_t max_size_name = 512;

	/* Size and padding of the full extension body */
	int64_t ext_size, ext_padding;
	size_t line_length, value_length, name_length;
	ssize_t to_read, did_read;
	const struct archive_entry_header_ustar *header;
	const char *p, *attr_start, *name_start;
	struct archive_string_conv *sconv;
	struct archive_string *pas = NULL;
	struct archive_string attr_name;
	int err = ARCHIVE_OK, r;

	header = (const struct archive_entry_header_ustar *)h;
	ext_size  = tar_atol(header->size, sizeof(header->size));
	if (ext_size > entry_limit) {
		return (ARCHIVE_FATAL);
	}
	if (ext_size < 0) {
	  archive_set_error(&a->archive, EINVAL,
			    "pax extension header has invalid size: %lld",
			    (long long)ext_size);
	  return (ARCHIVE_FATAL);
	}

	ext_padding = 0x1ff & (-ext_size);
	if (ext_size > ext_size_limit) {
		/* Consume the pax extension body and return an error */
		if (ext_size + ext_padding != __archive_read_consume(a, ext_size + ext_padding)) {
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive, EINVAL,
		    "Ignoring oversized pax extensions: %d > %d",
		    (int)ext_size, (int)ext_size_limit);
		return (ARCHIVE_WARN);
	}
	tar_flush_unconsumed(a, unconsumed);

	/* Parse the size/name of each pax attribute in the body */
	archive_string_init(&attr_name);
	while (ext_size > 0) {
		/* Read enough bytes to parse the size/name of the next attribute */
		to_read = max_size_name;
		if (to_read > ext_size) {
			to_read = ext_size;
		}
		p = __archive_read_ahead(a, to_read, &did_read);
		if (p == NULL) { /* EOF */
			archive_set_error(&a->archive, EINVAL,
					  "Truncated tar archive"
					  " detected while reading pax attribute name");
			return (ARCHIVE_FATAL);
		}
		if (did_read > ext_size) {
			did_read = ext_size;
		}

		/* Parse size of attribute */
		line_length = 0;
		attr_start = p;
		while (1) {
			if (p >= attr_start + did_read) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attributes: overlarge attribute size field");
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			if (*p == ' ') {
				p++;
				break;
			}
			if (*p < '0' || *p > '9') {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attributes: malformed attribute size field");
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			line_length *= 10;
			line_length += *p - '0';
			if (line_length > max_parsed_line_length) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attribute: size > %lld",
						  (long long)max_parsed_line_length);
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			p++;
		}

		if ((int64_t)line_length > ext_size) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attribute:  %lld > %lld",
						  (long long)line_length, (long long)ext_size);
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
		}

		/* Parse name of attribute */
		if (p >= attr_start + did_read
		    || p >= attr_start + line_length
		    || *p == '=') {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
					  "Ignoring malformed pax attributes: empty name found");
			*unconsumed += ext_size + ext_padding;
			return (ARCHIVE_WARN);
		}
		name_start = p;
		while (1) {
			if (p >= attr_start + did_read || p >= attr_start + line_length) {
				archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
						  "Ignoring malformed pax attributes: overlarge attribute name");
				*unconsumed += ext_size + ext_padding;
				return (ARCHIVE_WARN);
			}
			if (*p == '=') {
				break;
			}
			p++;
		}
		name_length = p - name_start;
		p++; // Skip '='

		// Save the name before we consume it
		archive_strncpy(&attr_name, name_start, name_length);

		ext_size -= p - attr_start;
		value_length = line_length - (p - attr_start);

		/* Consume size, name, and `=` */
		*unconsumed += p - attr_start;
		tar_flush_unconsumed(a, unconsumed);

		/* pax_attribute will consume value_length - 1 */
		r = pax_attribute(a, tar, entry, attr_name.s, archive_strlen(&attr_name), value_length - 1, unconsumed);
		ext_size -= value_length - 1;

		// Release the allocated attr_name (either here or before every return in this function)
		archive_string_free(&attr_name);

		if (r < ARCHIVE_WARN) {
			*unconsumed += ext_size + ext_padding;
			return (r);
		}
		err = err_combine(err, r);

		/* Consume the `\n` that follows the pax attribute value. */
		tar_flush_unconsumed(a, unconsumed);
		p = __archive_read_ahead(a, 1, &did_read);
		if (p == NULL) {
			archive_set_error(&a->archive, EINVAL,
					  "Truncated tar archive"
					  " detected while completing pax attribute");
			return (ARCHIVE_FATAL);
		}
		if (p[0] != '\n') {
			archive_set_error(&a->archive, EINVAL,
					  "Malformed pax attributes");
			*unconsumed += ext_size + ext_padding;
			return (ARCHIVE_WARN);
		}
		ext_size -= 1;
		*unconsumed += 1;
		tar_flush_unconsumed(a, unconsumed);
	}
	*unconsumed += ext_size + ext_padding;

	/*
	 * Some PAX values -- pathname, linkpath, uname, gname --
	 * can't be copied into the entry until we know the character
	 * set to use:
	 */
	if (!tar->pax_hdrcharset_utf8)
		/* PAX specified "BINARY", so use the default charset */
		sconv = tar->opt_sconv;
	else {
		/* PAX default UTF-8 */
		sconv = archive_string_conversion_from_charset(
		    &(a->archive), "UTF-8", 1);
		if (sconv == NULL)
			return (ARCHIVE_FATAL);
		if (tar->compat_2x)
			archive_string_conversion_set_opt(sconv,
			    SCONV_SET_OPT_UTF8_LIBARCHIVE2X);
	}

	/* Pathname */
	pas = NULL;
	if (archive_strlen(&(tar->entry_pathname_override)) > 0) {
		/* Prefer GNU.sparse.name attribute if present */
		/* GNU sparse files store a fake name under the standard
		 * "pathname" key. */
		pas = &(tar->entry_pathname_override);
	} else if (archive_strlen(&(tar->entry_pathname)) > 0) {
		/* Use standard "pathname" PAX extension */
		pas = &(tar->entry_pathname);
	}
	if (pas != NULL) {
		if (archive_entry_copy_pathname_l(entry, pas->s,
		    archive_strlen(pas), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Pathname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_pathname(entry, pas->s);
		}
	}
	/* Uname */
	if (archive_strlen(&(tar->entry_uname)) > 0) {
		if (archive_entry_copy_uname_l(entry, tar->entry_uname.s,
		    archive_strlen(&(tar->entry_uname)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Uname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_uname(entry, tar->entry_uname.s);
		}
	}
	/* Gname */
	if (archive_strlen(&(tar->entry_gname)) > 0) {
		if (archive_entry_copy_gname_l(entry, tar->entry_gname.s,
		    archive_strlen(&(tar->entry_gname)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Gname");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_gname(entry, tar->entry_gname.s);
		}
	}
	/* Linkpath */
	if (archive_strlen(&(tar->entry_linkpath)) > 0) {
		if (archive_entry_copy_link_l(entry, tar->entry_linkpath.s,
		    archive_strlen(&(tar->entry_linkpath)), sconv) != 0) {
			err = set_conversion_failed_error(a, sconv, "Linkpath");
			if (err == ARCHIVE_FATAL)
				return (err);
			/* Use raw name without conversion */
			archive_entry_copy_link(entry, tar->entry_linkpath.s);
		}
	}

	/* Extension may have given us a corrected `entry_bytes_remaining` for
	 * the main entry; update the padding appropriately. */
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}